

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes_merge(par_shapes_mesh *dst,par_shapes_mesh *src)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  long *in_FS_OFFSET;
  int local_44;
  uint16_t *puStack_40;
  int i;
  uint16_t *striangles;
  uint16_t *ptriangles;
  int ntriangles;
  int uvsize;
  int vecsize;
  int npoints;
  int old_dst_npoints;
  uint16_t offset;
  par_shapes_mesh *src_local;
  par_shapes_mesh *dst_local;
  
  uVar1 = dst->npoints;
  sVar2 = (short)uVar1;
  iVar4 = dst->npoints;
  iVar3 = dst->npoints + src->npoints;
  pfVar5 = (float *)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),dst->points,
                                       iVar3 * 0xc,iVar4 * 3);
  dst->points = pfVar5;
  memcpy(dst->points + dst->npoints * 3,src->points,(long)(src->npoints * 0xc));
  dst->npoints = iVar3;
  if ((src->normals != (float *)0x0) || (dst->normals != (float *)0x0)) {
    pfVar5 = (float *)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),dst->normals,
                                         iVar3 * 0xc,iVar4 * 3);
    dst->normals = pfVar5;
    if (src->normals != (float *)0x0) {
      memcpy(dst->normals + (int)((uVar1 & 0xffff) * 3),src->normals,(long)(src->npoints * 0xc));
    }
  }
  if ((src->tcoords != (float *)0x0) || (dst->tcoords != (float *)0x0)) {
    pfVar5 = (float *)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),dst->tcoords,
                                         iVar3 * 8,iVar4 << 1);
    dst->tcoords = pfVar5;
    if (src->tcoords != (float *)0x0) {
      memcpy(dst->tcoords + (int)((uVar1 & 0xffff) << 1),src->tcoords,(long)(src->npoints * 8));
    }
  }
  iVar4 = dst->ntriangles + src->ntriangles;
  puVar6 = (uint16_t *)
           rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),dst->triangles,iVar4 * 6,
                              dst->ntriangles * 3);
  dst->triangles = puVar6;
  striangles = dst->triangles + dst->ntriangles * 3;
  puStack_40 = src->triangles;
  for (local_44 = 0; local_44 < src->ntriangles; local_44 = local_44 + 1) {
    *striangles = sVar2 + *puStack_40;
    puVar6 = puStack_40 + 2;
    puVar7 = striangles + 2;
    striangles[1] = sVar2 + puStack_40[1];
    puStack_40 = puStack_40 + 3;
    striangles = striangles + 3;
    *puVar7 = sVar2 + *puVar6;
  }
  dst->ntriangles = iVar4;
  return;
}

Assistant:

PARDEF void par_shapes_merge(par_shapes_mesh* dst, par_shapes_mesh const* src)
{
    PAR_SHAPES_T offset = dst->npoints;
    int old_dst_npoints = dst->npoints;
    int npoints = dst->npoints + src->npoints;
    int vecsize = sizeof(float) * 3;
    dst->points = PAR_REALLOC(float, dst->points, 3 * npoints, 3 * old_dst_npoints);
    memcpy(dst->points + 3 * dst->npoints, src->points, vecsize * src->npoints);
    dst->npoints = npoints;
    if (src->normals || dst->normals) {
        dst->normals = PAR_REALLOC(float, dst->normals, 3 * npoints, 3 * old_dst_npoints);
        if (src->normals) {
            memcpy(dst->normals + 3 * offset, src->normals,
                   vecsize * src->npoints);
        }
    }
    if (src->tcoords || dst->tcoords) {
        int uvsize = sizeof(float) * 2;
        dst->tcoords = PAR_REALLOC(float, dst->tcoords, 2 * npoints, 2 * old_dst_npoints);
        if (src->tcoords) {
            memcpy(dst->tcoords + 2 * offset, src->tcoords,
                   uvsize * src->npoints);
        }
    }
    int ntriangles = dst->ntriangles + src->ntriangles;
    dst->triangles = PAR_REALLOC(PAR_SHAPES_T, dst->triangles, 3 * ntriangles, 3 * dst->ntriangles);
    PAR_SHAPES_T* ptriangles = dst->triangles + 3 * dst->ntriangles;
    PAR_SHAPES_T const* striangles = src->triangles;
    for (int i = 0; i < src->ntriangles; i++) {
        *ptriangles++ = offset + *striangles++;
        *ptriangles++ = offset + *striangles++;
        *ptriangles++ = offset + *striangles++;
    }
    dst->ntriangles = ntriangles;
}